

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeShadowTestInstance *this)

{
  float *pfVar1;
  pointer pfVar2;
  TextureRenderer *this_00;
  Vec2 *vec;
  Vec2 *vec_00;
  ulong uVar3;
  int *piVar4;
  ostringstream *this_01;
  TestLog *log;
  pointer pFVar5;
  TestContext *pTVar6;
  bool bVar7;
  int i;
  deUint32 width;
  deUint32 height;
  int iVar8;
  undefined8 *puVar9;
  TestTextureCube *pTVar10;
  size_t sVar11;
  long lVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  char *__s;
  CubeFace face;
  TextureFormat in_stack_fffffffffffffcb8;
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  TexComparePrecision local_2e8;
  pointer local_2c0;
  LodPrecision lodPrecision;
  undefined4 uStack_2ac;
  ulong local_2a8 [2];
  TextureFormat local_298;
  PixelFormat pixelFormat;
  ulong local_280 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  string *local_268;
  ScopedLogSection iterSection;
  ReferenceParams sampleParams;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [12];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  piVar4 = local_2e8.uvwBits.m_data + 1;
  local_2e8.coordBits.m_data._0_8_ = piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = (long)result.m_pixels.m_ptr +
          CONCAT44(local_2e8.uvwBits.m_data[0],local_2e8.coordBits.m_data[2]);
  uVar14 = 0xf;
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar4) {
    uVar14 = CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]);
  }
  if (uVar14 < uVar3) {
    uVar14 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar14 = result.m_pixels.m_cap;
    }
    if (uVar14 < uVar3) goto LAB_00814137;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&result,0,(char *)0x0,local_2e8.coordBits.m_data._0_8_);
  }
  else {
LAB_00814137:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2e8,CONCAT44(result.m_height,result.m_width));
  }
  sampleParams.super_RenderParams._0_8_ = sampleParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar9 + 2);
  if ((float *)*puVar9 == pfVar1) {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)(puVar9 + 3);
    sampleParams.super_RenderParams.bias = *(float *)((long)puVar9 + 0x1c);
  }
  else {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams._0_8_ = (float *)*puVar9;
  }
  sampleParams.super_RenderParams._8_8_ = puVar9[1];
  *puVar9 = pfVar1;
  puVar9[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = CONCAT44(uStack_2ac,lodPrecision.lodBits) + pixelFormat._8_8_;
  uVar14 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_280) {
    uVar14 = local_280[0];
  }
  if (uVar14 < uVar3) {
    uVar14 = 0xf;
    if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_2a8) {
      uVar14 = local_2a8[0];
    }
    if (uVar3 <= uVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&lodPrecision,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_008142a6;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&pixelFormat,CONCAT44(lodPrecision.derivateBits,lodPrecision.rule));
LAB_008142a6:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar9 + 2);
  if ((pointer)*puVar9 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar9;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar9[1];
  *puVar9 = pfVar2;
  puVar9[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&iterSection,log,(string *)&sampleParams,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_2a8) {
    operator_delete((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule),local_2a8[0] + 1)
    ;
  }
  if ((ulong *)pixelFormat._0_8_ != local_280) {
    operator_delete((void *)pixelFormat._0_8_,local_280[0] + 1);
  }
  if ((float *)sampleParams.super_RenderParams._0_8_ != sampleParams.super_RenderParams.w.m_data + 1
     ) {
    operator_delete((void *)sampleParams.super_RenderParams._0_8_,
                    sampleParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar4) {
    operator_delete((void *)local_2e8.coordBits.m_data._0_8_,
                    CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]) + 1);
  }
  iVar8 = this->m_caseNdx;
  pFVar5 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->m_renderer;
  pTVar10 = util::TextureRenderer::getCubeTexture(this_00,pFVar5[iVar8].textureIndex);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_CUBE);
  util::createSampler((Sampler *)local_1b0,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  local_2c0 = pFVar5 + iVar8;
  this_01 = (ostringstream *)(local_1b0 + 8);
  sampleParams.sampler._16_8_ = local_1a0[0].m_log;
  sampleParams.sampler.wrapS = local_1b0._0_4_;
  sampleParams.sampler.wrapT = local_1b0._4_4_;
  sampleParams.sampler.wrapR = local_1b0._8_4_;
  sampleParams.sampler.minFilter = local_1b0._12_4_;
  sampleParams.sampler._32_8_ = local_1a0[2].m_log;
  sampleParams.sampler.borderColor.v.uData[1] = local_1a0[3].m_log._0_4_;
  sampleParams.sampler.borderColor.v._8_8_ = local_1a0._28_8_;
  sampleParams.sampler._53_7_ = SUB87(local_1a0._36_8_,1);
  sampleParams.sampler.seamlessCubeMap = true;
  sampleParams.sampler.compare =
       (this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  sampleParams.sampler.normalizedCoords = (bool)local_1a0[1].m_log._0_1_;
  sampleParams.sampler._25_3_ = local_1a0[1].m_log._1_3_;
  sampleParams.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
  sampleParams.lodMode = LODMODE_EXACT;
  sampleParams.super_RenderParams.ref = local_2c0->ref;
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"Compare reference value = ",0x1a);
  std::ostream::_M_insert<double>((double)sampleParams.super_RenderParams.ref);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Coordinates: ",0xd);
  vec = &local_2c0->bottomLeft;
  tcu::operator<<((ostream *)this_01,vec);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," -> ",4);
  vec_00 = &local_2c0->topRight;
  tcu::operator<<((ostream *)this_01,vec_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_138);
  local_268 = (string *)&__return_storage_ptr__->m_description;
  local_270 = &(__return_storage_ptr__->m_description).field_2;
  face = CUBEFACE_NEGATIVE_X;
  do {
    width = util::TextureRenderer::getRenderWidth(this_00);
    height = util::TextureRenderer::getRenderHeight(this_00);
    tcu::Surface::Surface(&result,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,face,vec,vec_00);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Face ",5);
    switch(face) {
    case CUBEFACE_NEGATIVE_X:
      bVar7 = false;
      __s = "-X";
      break;
    case CUBEFACE_POSITIVE_X:
      bVar7 = false;
      __s = "+X";
      break;
    case CUBEFACE_NEGATIVE_Y:
      bVar7 = false;
      __s = "-Y";
      break;
    case CUBEFACE_POSITIVE_Y:
      bVar7 = false;
      __s = "+Y";
      break;
    case CUBEFACE_NEGATIVE_Z:
      bVar7 = false;
      __s = "-Z";
      break;
    case CUBEFACE_POSITIVE_Z:
      bVar7 = false;
      __s = "+Z";
      break;
    default:
      bVar7 = true;
      __s = (char *)0x0;
    }
    if (bVar7) {
      std::ios::clear((int)local_1b0 + 8 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
    }
    else {
      sVar11 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),__s,sVar11);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    util::TextureRenderer::renderQuad
              (this_00,&result,local_2c0->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&sampleParams);
    ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    pixelFormat = getPixelFormat(in_stack_fffffffffffffcb8);
    lodPrecision.rule = RULE_VULKAN;
    lVar12 = 0;
    do {
      local_2e8.coordBits.m_data[lVar12] = 0x16;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 3;
    do {
      local_2e8.coordBits.m_data[lVar12] = 0x10;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    local_2e8.coordBits.m_data._0_8_ = (int *)0xa0000000a;
    local_2e8.coordBits.m_data[2] = 10;
    local_2e8.uvwBits.m_data[0] = 6;
    local_2e8.uvwBits.m_data[1] = 6;
    local_2e8.uvwBits.m_data[2] = 0;
    local_2e8.pcfBits = 5;
    local_2e8.referenceBits = 0x10;
    local_2e8.resultBits = pixelFormat.redBits + -1;
    pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_298.order = RGBA;
    local_298.type = UNORM_INT8;
    pvVar15 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar15 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_298,result.m_width,result.m_height,1,pvVar15);
    iVar8 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
    bVar7 = verifyTexCompareResult<tcu::TextureCube>
                      (pTVar6,(ConstPixelBufferAccess *)local_1b0,
                       (TextureCube *)CONCAT44(extraout_var,iVar8),
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&sampleParams,&local_2e8,&lodPrecision,
                       &pixelFormat);
    if (!bVar7) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      lodPrecision.lodBits = 4;
      local_2e8.uvwBits.m_data[0] = 4;
      local_2e8.uvwBits.m_data[1] = 4;
      local_2e8.uvwBits.m_data[2] = 0;
      local_2e8.pcfBits = 0;
      pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx;
      local_298.order = RGBA;
      local_298.type = UNORM_INT8;
      pvVar15 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar15 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,&local_298,result.m_width,result.m_height,1,pvVar15)
      ;
      iVar8 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
      bVar7 = verifyTexCompareResult<tcu::TextureCube>
                        (pTVar6,(ConstPixelBufferAccess *)local_1b0,
                         (TextureCube *)CONCAT44(extraout_var_00,iVar8),
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&sampleParams,&local_2e8,&lodPrecision,
                         &pixelFormat);
      if (!bVar7) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Image verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_270;
        std::__cxx11::string::_M_construct<char*>
                  (local_268,local_1b0._0_8_,(long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        if (!bVar7) {
          if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          tcu::Surface::~Surface(&result);
          goto LAB_00814b6b;
        }
      }
    }
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    if (face == CUBEFACE_LAST) {
      iVar13 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar13;
      iVar8 = (int)((ulong)((long)(this->m_cases).
                                  super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_cases).
                                 super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (SBORROW4(iVar13,iVar8 * -0x55555555) == iVar13 + iVar8 * 0x55555555 < 0) {
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_270;
        std::__cxx11::string::_M_construct<char*>
                  (local_268,local_1b0._0_8_,(long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
      }
      else {
        tcu::TestStatus::incomplete();
      }
      if ((SBORROW4(iVar13,iVar8 * -0x55555555) == iVar13 + iVar8 * 0x55555555 < 0) &&
         ((TestLog *)local_1b0._0_8_ != local_1a0)) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
LAB_00814b6b:
      tcu::TestLog::endSection(iterSection.m_log);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeShadowTestInstance::iterate (void)
{

	tcu::TestLog&						log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection			iterSection		(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&					curCase			= m_cases[m_caseNdx];
	const pipeline::TestTextureCube&	texture			= m_renderer.getCubeTexture(curCase.textureIndex);

	ReferenceParams						sampleParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	sampleParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= m_testParameters.compareOp;
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	log	<< TestLog::Message
		<< "Compare reference value = " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(result, curCase.textureIndex, &texCoord[0], sampleParams);

		{
			const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				log << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}